

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetTxInFinalScript
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this,uint32_t index,bool is_witness_stack)

{
  void *pvVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  long lVar3;
  ulong uVar4;
  ByteData local_48;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xae3,"GetTxInFinalScript");
  pvVar1 = this->wally_psbt_pointer_;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,is_witness_stack) == 0) {
    lVar3 = *(long *)((long)pvVar1 + 0x10);
    ByteData::ByteData(&local_48,*(uint8_t **)(lVar3 + 0x30 + (ulong)index * 0x110),
                       *(uint32_t *)(lVar3 + 0x38 + (ulong)index * 0x110));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_48);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    plVar2 = *(long **)(*(long *)((long)pvVar1 + 0x10) + 0x40 + (ulong)index * 0x110);
    if ((plVar2 != (long *)0x0) && (plVar2[1] != 0)) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        ByteData::ByteData(&local_48,*(uint8_t **)(*plVar2 + -8 + lVar3),
                           *(uint32_t *)(*plVar2 + lVar3));
        ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_48);
        if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < (ulong)plVar2[1]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetTxInFinalScript(
    uint32_t index, bool is_witness_stack) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;

  if (is_witness_stack) {
    auto stacks = psbt_pointer->inputs[index].final_witness;
    if (stacks != nullptr) {
      for (size_t stack_idx = 0; stack_idx < stacks->num_items; ++stack_idx) {
        result.emplace_back(ByteData(
            stacks->items[stack_idx].witness,
            static_cast<uint32_t>(stacks->items[stack_idx].witness_len)));
      }
    }
  } else {
    result.emplace_back(ByteData(
        psbt_pointer->inputs[index].final_scriptsig,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].final_scriptsig_len)));
  }
  return result;
}